

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O2

void ncnn::pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 *puVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar33 [32];
  undefined1 in_ZMM7 [64];
  
  auVar33 = in_ZMM7._0_32_;
  iVar16 = cpu_support_x86_avx_vnni_int8();
  auVar11 = _DAT_0054f9e0;
  if (iVar16 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pauVar21 = (undefined1 (*) [16])AT->data;
  lVar24 = (long)k;
  lVar29 = (long)i;
  lVar25 = (long)max_ii;
  lVar20 = lVar29 + 1;
  uVar27 = 0;
  auVar12 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar30._8_4_ = 0xc080400;
  auVar30._0_8_ = 0xc0804000c080400;
  auVar30._12_4_ = 0xc080400;
  auVar30._16_4_ = 0xc080400;
  auVar30._20_4_ = 0xc080400;
  auVar30._24_4_ = 0xc080400;
  auVar30._28_4_ = 0xc080400;
  while( true ) {
    if (lVar25 <= (long)(uVar27 | 7)) {
      auVar10 = vpmovsxbd_avx(ZEXT416(0x3020100));
      while( true ) {
        if (lVar25 <= (long)(uVar27 | 3)) {
          for (; (long)(uVar27 | 1) < lVar25; uVar27 = uVar27 + 2) {
            pvVar9 = A->data;
            lVar17 = A->elemsize * lVar29 * (long)A->w;
            lVar23 = lVar17 + lVar24;
            lVar22 = A->elemsize * lVar20 * (long)A->w;
            lVar15 = lVar22 + lVar24;
            iVar18 = 0;
            iVar16 = 0;
            pauVar28 = pauVar21;
            for (lVar26 = 0; iVar13 = (int)lVar26, iVar13 + 3 < max_kk; lVar26 = lVar26 + 4) {
              cVar1 = *(char *)((long)pvVar9 + lVar26 + lVar23);
              (*pauVar21)[lVar26 * 2] = cVar1;
              cVar2 = *(char *)((long)pvVar9 + lVar26 + lVar23 + 1);
              (*pauVar21)[lVar26 * 2 + 1] = cVar2;
              cVar3 = *(char *)((long)pvVar9 + lVar26 + lVar23 + 2);
              (*pauVar21)[lVar26 * 2 + 2] = cVar3;
              cVar4 = *(char *)((long)pvVar9 + lVar26 + lVar23 + 3);
              (*pauVar21)[lVar26 * 2 + 3] = cVar4;
              cVar5 = *(char *)((long)pvVar9 + lVar26 + lVar15);
              (*pauVar21)[lVar26 * 2 + 4] = cVar5;
              cVar6 = *(char *)((long)pvVar9 + lVar26 + lVar15 + 1);
              (*pauVar21)[lVar26 * 2 + 5] = cVar6;
              cVar7 = *(char *)((long)pvVar9 + lVar26 + lVar15 + 2);
              (*pauVar21)[lVar26 * 2 + 6] = cVar7;
              cVar8 = *(char *)((long)pvVar9 + lVar26 + lVar15 + 3);
              (*pauVar21)[lVar26 * 2 + 7] = cVar8;
              iVar18 = (int)cVar2 + (int)cVar3 + iVar18 + cVar1 + (int)cVar4;
              iVar16 = (int)cVar6 + (int)cVar7 + iVar16 + cVar5 + (int)cVar8;
              pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            }
            if (3 < max_kk) {
              *(int *)*pauVar28 = iVar18 * 0x7f;
              *(int *)(*pauVar21 + lVar26 * 2 + 4) = iVar16 * 0x7f;
              pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            }
            lVar17 = lVar17 + lVar26 + lVar24;
            lVar22 = lVar22 + lVar26 + lVar24;
            pauVar21 = pauVar28;
            for (lVar19 = 0; iVar13 + (int)lVar19 + 1 < max_kk; lVar19 = lVar19 + 2) {
              (*pauVar28)[lVar19 * 2] = *(undefined1 *)((long)pvVar9 + lVar19 + lVar17);
              (*pauVar28)[lVar19 * 2 + 1] = *(undefined1 *)((long)pvVar9 + lVar19 + lVar17 + 1);
              (*pauVar28)[lVar19 * 2 + 2] = *(undefined1 *)((long)pvVar9 + lVar19 + lVar22);
              (*pauVar28)[lVar19 * 2 + 3] = *(undefined1 *)((long)pvVar9 + lVar19 + lVar22 + 1);
              pauVar21 = (undefined1 (*) [16])(*pauVar21 + 4);
              lVar26 = lVar26 + 2;
            }
            for (; (int)lVar26 < max_kk; lVar26 = lVar26 + 1) {
              (*pauVar21)[0] = *(undefined1 *)((long)pvVar9 + lVar26 + lVar23);
              (*pauVar21)[1] = *(undefined1 *)((long)pvVar9 + lVar26 + lVar15);
              pauVar21 = (undefined1 (*) [16])(*pauVar21 + 2);
            }
            lVar29 = lVar29 + 2;
            lVar20 = lVar20 + 2;
          }
          for (; (long)uVar27 < lVar25; uVar27 = uVar27 + 1) {
            pvVar9 = A->data;
            lVar20 = A->elemsize * lVar29 * (long)A->w + lVar24;
            iVar16 = 0;
            for (lVar23 = 0; (int)lVar23 + 3 < max_kk; lVar23 = lVar23 + 4) {
              cVar1 = *(char *)((long)pvVar9 + lVar23 + lVar20);
              (*pauVar21)[lVar23] = cVar1;
              cVar2 = *(char *)((long)pvVar9 + lVar23 + lVar20 + 1);
              (*pauVar21)[lVar23 + 1] = cVar2;
              cVar3 = *(char *)((long)pvVar9 + lVar23 + lVar20 + 2);
              (*pauVar21)[lVar23 + 2] = cVar3;
              cVar4 = *(char *)((long)pvVar9 + lVar23 + lVar20 + 3);
              (*pauVar21)[lVar23 + 3] = cVar4;
              iVar16 = (int)cVar2 + (int)cVar3 + iVar16 + cVar1 + (int)cVar4;
            }
            if (max_kk < 4) {
              pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar23);
            }
            else {
              puVar14 = *pauVar21;
              pauVar21 = (undefined1 (*) [16])((long)(puVar14 + lVar23) + 4);
              *(int *)(puVar14 + lVar23) = iVar16 * 0x7f;
            }
            for (; (int)lVar23 < max_kk; lVar23 = lVar23 + 1) {
              (*pauVar21)[0] = *(undefined1 *)((long)pvVar9 + lVar23 + lVar20);
              pauVar21 = (undefined1 (*) [16])(*pauVar21 + 1);
            }
            lVar29 = lVar29 + 1;
          }
          return;
        }
        iVar16 = A->w;
        auVar31._4_4_ = iVar16;
        auVar31._0_4_ = iVar16;
        auVar31._8_4_ = iVar16;
        auVar31._12_4_ = iVar16;
        vpmulld_avx(auVar31,auVar10);
        iVar16 = 0;
        if (3 < max_kk) break;
        if (3 < max_kk) {
          *pauVar21 = (undefined1  [16])0x0;
          pauVar21 = pauVar21 + 1;
        }
        for (; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
          auVar31 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
          auVar31 = vpgatherdd((undefined1  [16])0x0,auVar31);
          in_ZMM6 = ZEXT1664((undefined1  [16])0x0);
          auVar31 = vpshufb_avx(auVar31,ZEXT816(0xd0c090805040100));
          *(long *)*pauVar21 = auVar31._0_8_;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
        }
        for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
          auVar31 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
          auVar31 = vpgatherdd((undefined1  [16])0x0,auVar31);
          in_ZMM6 = ZEXT1664((undefined1  [16])0x0);
          auVar31 = vpshufb_avx(auVar31,SUB6416(ZEXT464(0xc080400),0));
          *(int *)*pauVar21 = auVar31._0_4_;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + 4);
        }
        uVar27 = uVar27 + 4;
        lVar29 = lVar29 + 4;
        lVar20 = lVar20 + 4;
      }
      auVar10 = vpcmpeqd_avx(auVar33._0_16_,auVar33._0_16_);
      vpgatherdd((undefined1  [16])0x0,auVar10);
      halt_baddata();
    }
    iVar16 = A->w;
    auVar32._4_4_ = iVar16;
    auVar32._0_4_ = iVar16;
    auVar32._8_4_ = iVar16;
    auVar32._12_4_ = iVar16;
    auVar32._16_4_ = iVar16;
    auVar32._20_4_ = iVar16;
    auVar32._24_4_ = iVar16;
    auVar32._28_4_ = iVar16;
    vpmulld_avx2(auVar32,auVar12);
    iVar16 = 0;
    if (3 < max_kk) break;
    if (3 < max_kk) {
      *(undefined8 *)*pauVar21 = 0;
      *(undefined8 *)(*pauVar21 + 8) = 0;
      *(undefined8 *)pauVar21[1] = 0;
      *(undefined8 *)(pauVar21[1] + 8) = 0;
      pauVar21 = pauVar21 + 2;
    }
    for (; iVar16 + 1 < max_kk; iVar16 = iVar16 + 2) {
      auVar32 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
      auVar32 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
      in_ZMM6 = ZEXT3264((undefined1  [32])0x0);
      auVar32 = vpshufb_avx2(auVar32,auVar11);
      auVar32 = vpermq_avx2(auVar32,0xe8);
      *pauVar21 = auVar32._0_16_;
      pauVar21 = pauVar21 + 1;
    }
    for (; iVar16 < max_kk; iVar16 = iVar16 + 1) {
      auVar32 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
      auVar32 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
      auVar32 = vpshufb_avx2(auVar32,auVar30);
      in_ZMM6 = ZEXT1664(auVar32._16_16_);
      auVar10 = vpunpckldq_avx(auVar32._0_16_,auVar32._16_16_);
      *(long *)*pauVar21 = auVar10._0_8_;
      pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
    }
    uVar27 = uVar27 + 8;
    lVar29 = lVar29 + 8;
    lVar20 = lVar20 + 8;
  }
  auVar11 = vpcmpeqd_avx2(auVar33,auVar33);
  vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar11);
  halt_baddata();
}

Assistant:

void pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}